

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTest.cpp
# Opt level: O1

bool __thiscall DOMTest::testBaseURI(DOMTest *this,XercesDOMParser *parser)

{
  short *psVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  wchar16 *pwVar8;
  wchar16 *pwVar9;
  long *plVar10;
  wchar16 *pwVar11;
  wchar16 *pwVar12;
  wchar16 *pwVar13;
  long lVar14;
  wchar16 *pwVar15;
  wchar16 *pwVar16;
  wchar16 *pwVar17;
  wchar16 *pwVar18;
  wchar16 *pwVar19;
  long *plVar20;
  wchar16 *pwVar21;
  ulong uVar22;
  bool bVar23;
  
  xercesc_4_0::AbstractDOMParser::parse((char *)parser);
  lVar7 = xercesc_4_0::AbstractDOMParser::getErrorCount();
  if (lVar7 == 0) {
    pwVar8 = (wchar16 *)
             xercesc_4_0::XMLString::transcode
                       ("file://",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar9 = (wchar16 *)
             xercesc_4_0::XMLString::transcode
                       ("samples/data/personal-schema.xml",
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    plVar10 = (long *)xercesc_4_0::AbstractDOMParser::getDocument();
    plVar20 = plVar10 + 3;
    pwVar11 = (wchar16 *)(**(code **)(plVar10[3] + 0xf8))(plVar20);
    iVar2 = xercesc_4_0::XMLString::patternMatch(pwVar11,pwVar8);
    if (iVar2 == -1) {
      testBaseURI();
    }
    iVar3 = xercesc_4_0::XMLString::patternMatch(pwVar11,pwVar9);
    if (iVar3 == -1) {
      testBaseURI();
    }
    lVar7 = 0;
    if (pwVar11 != (wchar16 *)0x0) {
      do {
        psVar1 = (short *)((long)pwVar11 + lVar7);
        lVar7 = lVar7 + 2;
      } while (*psVar1 != 0);
      lVar7 = (lVar7 >> 1) + -1;
    }
    uVar22 = 0xffffffffffffffff;
    if (-1 < lVar7) {
      uVar22 = lVar7 * 2;
    }
    pwVar8 = (wchar16 *)operator_new__(uVar22);
    uVar22 = 0;
    if (pwVar11 != (wchar16 *)0x0) {
      do {
        psVar1 = (short *)((long)pwVar11 + uVar22);
        uVar22 = uVar22 + 2;
      } while (*psVar1 != 0);
      uVar22 = ((long)uVar22 >> 1) - 1;
    }
    iVar4 = xercesc_4_0::XMLString::lastIndexOf(L'/',pwVar11,uVar22);
    xercesc_4_0::XMLString::copyNString(pwVar8,pwVar11,(long)(iVar4 + 1));
    lVar7 = 0;
    do {
      lVar14 = lVar7;
      lVar7 = lVar14 + 2;
    } while (*(short *)((long)pwVar8 + lVar14) != 0);
    uVar22 = 0xffffffffffffffff;
    if (-0x10 < lVar14 + 2) {
      uVar22 = lVar14 + 0x10;
    }
    pwVar9 = (wchar16 *)operator_new__(uVar22);
    xercesc_4_0::XMLString::copyString(pwVar9,pwVar8);
    pwVar12 = (wchar16 *)
              xercesc_4_0::XMLString::transcode
                        ("foo/bar",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    xercesc_4_0::XMLString::catString(pwVar9,pwVar12);
    lVar7 = 0;
    do {
      lVar14 = lVar7;
      lVar7 = lVar14 + 2;
    } while (*(short *)((long)pwVar8 + lVar14) != 0);
    uVar22 = 0xffffffffffffffff;
    if (-0x18 < lVar14 + 2) {
      uVar22 = lVar14 + 0x18;
    }
    pwVar12 = (wchar16 *)operator_new__(uVar22);
    xercesc_4_0::XMLString::copyString(pwVar12,pwVar8);
    pwVar13 = (wchar16 *)
              xercesc_4_0::XMLString::transcode
                        ("foo/bar/bar",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    xercesc_4_0::XMLString::catString(pwVar12,pwVar13);
    lVar7 = 0;
    do {
      lVar14 = lVar7;
      lVar7 = lVar14 + 2;
    } while (*(short *)((long)pwVar8 + lVar14) != 0);
    uVar22 = 0xffffffffffffffff;
    if (-0x18 < lVar14 + 2) {
      uVar22 = lVar14 + 0x18;
    }
    pwVar13 = (wchar16 *)operator_new__(uVar22);
    xercesc_4_0::XMLString::copyString(pwVar13,pwVar8);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XMLString::transcode
                       ("foo/car/bar",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    xercesc_4_0::XMLString::catString(pwVar13,pwVar8);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XMLString::transcode
                       ("file:///auto/bar",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar15 = (wchar16 *)
              xercesc_4_0::XMLString::transcode
                        ("file:///car/foo/",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar16 = (wchar16 *)
              xercesc_4_0::XMLString::transcode
                        ("file:///car/foo/bar/bar",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar17 = (wchar16 *)
              xercesc_4_0::XMLString::transcode
                        ("http://www.example.com/car/car",
                         xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar18 = (wchar16 *)
              xercesc_4_0::XMLString::transcode
                        ("http://www.example.com/bar/foo/",
                         xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar19 = (wchar16 *)
              xercesc_4_0::XMLString::transcode
                        ("http://www.example.com/bar/foo/foo/bar",
                         xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    plVar20 = (long *)(**(code **)(*plVar20 + 0x38))(plVar20);
    iVar4 = (**(code **)(*plVar20 + 0x20))(plVar20);
    while (iVar4 != 7) {
      plVar20 = (long *)(**(code **)(*plVar20 + 0x50))(plVar20);
      iVar4 = (**(code **)(*plVar20 + 0x20))(plVar20);
    }
    pwVar21 = (wchar16 *)(**(code **)(*plVar20 + 0xf8))(plVar20);
    iVar4 = xercesc_4_0::XMLString::compareString(pwVar21,pwVar11);
    if (iVar4 != 0) {
      testBaseURI();
    }
    plVar20 = (long *)(**(code **)(*plVar10 + 0x68))(plVar10);
    pwVar21 = (wchar16 *)(**(code **)(*plVar20 + 0xf8))(plVar20);
    iVar5 = xercesc_4_0::XMLString::compareString(pwVar21,pwVar11);
    if (iVar5 != 0) {
      testBaseURI();
    }
    plVar20 = (long *)(**(code **)(*plVar20 + 0x38))(plVar20);
    while (iVar6 = (**(code **)(*plVar20 + 0x20))(plVar20), iVar6 != 1) {
      plVar20 = (long *)(**(code **)(*plVar20 + 0x50))(plVar20);
    }
    plVar10 = (long *)(**(code **)(*plVar20 + 0x38))(plVar20);
    while (iVar6 = (**(code **)(*plVar10 + 0x20))(plVar10), iVar6 != 1) {
      plVar10 = (long *)(**(code **)(*plVar10 + 0x50))(plVar10);
    }
    pwVar11 = (wchar16 *)(**(code **)(*plVar10 + 0xf8))(plVar10);
    iVar6 = xercesc_4_0::XMLString::compareString(pwVar11,pwVar9);
    if (iVar6 != 0) {
      testBaseURI();
    }
    bVar23 = iVar6 == 0 && (iVar5 == 0 && (iVar4 == 0 && (iVar3 != -1 && iVar2 != -1)));
    plVar10 = (long *)(**(code **)(*plVar10 + 0x38))(plVar10);
    while (iVar2 = (**(code **)(*plVar10 + 0x20))(plVar10), iVar2 != 1) {
      plVar10 = (long *)(**(code **)(*plVar10 + 0x50))(plVar10);
    }
    pwVar11 = (wchar16 *)(**(code **)(*plVar10 + 0xf8))(plVar10);
    iVar2 = xercesc_4_0::XMLString::compareString(pwVar11,pwVar12);
    if (iVar2 != 0) {
      testBaseURI();
      bVar23 = false;
    }
    do {
      plVar10 = (long *)(**(code **)(*plVar10 + 0x50))(plVar10);
      iVar2 = (**(code **)(*plVar10 + 0x20))(plVar10);
    } while (iVar2 != 1);
    pwVar11 = (wchar16 *)(**(code **)(*plVar10 + 0xf8))(plVar10);
    iVar2 = xercesc_4_0::XMLString::compareString(pwVar11,pwVar13);
    if (iVar2 != 0) {
      testBaseURI();
      bVar23 = false;
    }
    do {
      plVar10 = (long *)(**(code **)(*plVar10 + 0x50))(plVar10);
      iVar2 = (**(code **)(*plVar10 + 0x20))(plVar10);
    } while (iVar2 != 7);
    pwVar11 = (wchar16 *)(**(code **)(*plVar10 + 0xf8))(plVar10);
    iVar2 = xercesc_4_0::XMLString::compareString(pwVar11,pwVar9);
    if (iVar2 != 0) {
      testBaseURI();
      bVar23 = false;
    }
    lVar7 = *plVar20;
    while( true ) {
      plVar20 = (long *)(**(code **)(lVar7 + 0x50))(plVar20);
      iVar2 = (**(code **)(*plVar20 + 0x20))(plVar20);
      if (iVar2 == 1) break;
      lVar7 = *plVar20;
    }
    pwVar9 = (wchar16 *)(**(code **)(*plVar20 + 0xf8))(plVar20);
    iVar2 = xercesc_4_0::XMLString::compareString(pwVar9,pwVar8);
    if (iVar2 != 0) {
      testBaseURI();
      bVar23 = false;
    }
    plVar10 = (long *)(**(code **)(*plVar20 + 0x38))(plVar20);
    while (iVar2 = (**(code **)(*plVar10 + 0x20))(plVar10), iVar2 != 1) {
      plVar10 = (long *)(**(code **)(*plVar10 + 0x50))(plVar10);
    }
    pwVar8 = (wchar16 *)(**(code **)(*plVar10 + 0xf8))(plVar10);
    iVar2 = xercesc_4_0::XMLString::compareString(pwVar8,pwVar15);
    if (iVar2 != 0) {
      testBaseURI();
      bVar23 = false;
    }
    plVar10 = (long *)(**(code **)(*plVar10 + 0x38))(plVar10);
    while (iVar2 = (**(code **)(*plVar10 + 0x20))(plVar10), iVar2 != 1) {
      plVar10 = (long *)(**(code **)(*plVar10 + 0x50))(plVar10);
    }
    pwVar8 = (wchar16 *)(**(code **)(*plVar10 + 0xf8))(plVar10);
    iVar2 = xercesc_4_0::XMLString::compareString(pwVar8,pwVar16);
    if (iVar2 != 0) {
      testBaseURI();
      bVar23 = false;
    }
    do {
      plVar20 = (long *)(**(code **)(*plVar20 + 0x50))(plVar20);
      iVar2 = (**(code **)(*plVar20 + 0x20))(plVar20);
    } while (iVar2 != 1);
    pwVar8 = (wchar16 *)(**(code **)(*plVar20 + 0xf8))(plVar20);
    iVar2 = xercesc_4_0::XMLString::compareString(pwVar8,pwVar17);
    if (iVar2 != 0) {
      testBaseURI();
      bVar23 = false;
    }
    plVar20 = (long *)(**(code **)(*plVar20 + 0x38))(plVar20);
    while (iVar2 = (**(code **)(*plVar20 + 0x20))(plVar20), iVar2 != 1) {
      plVar20 = (long *)(**(code **)(*plVar20 + 0x50))(plVar20);
    }
    pwVar8 = (wchar16 *)(**(code **)(*plVar20 + 0xf8))(plVar20);
    iVar2 = xercesc_4_0::XMLString::compareString(pwVar8,pwVar18);
    if (iVar2 != 0) {
      testBaseURI();
      bVar23 = false;
    }
    plVar20 = (long *)(**(code **)(*plVar20 + 0x38))(plVar20);
    while (iVar2 = (**(code **)(*plVar20 + 0x20))(plVar20), iVar2 != 1) {
      plVar20 = (long *)(**(code **)(*plVar20 + 0x50))(plVar20);
    }
    pwVar8 = (wchar16 *)(**(code **)(*plVar20 + 0xf8))(plVar20);
    iVar2 = xercesc_4_0::XMLString::compareString(pwVar8,pwVar19);
    if (iVar2 != 0) {
      testBaseURI();
      bVar23 = false;
    }
  }
  else {
    puts("baseURI test was not carried out");
    bVar23 = true;
  }
  return bVar23;
}

Assistant:

bool DOMTest::testBaseURI(XercesDOMParser* parser) {

    bool OK = true;

    try {
        // this one assumes executing in samples/data where personal-schema.xml resides
        // please modify if this is not correct
        parser->parse("personal-schema.xml");
    }
    catch (const OutOfMemoryException&)
    {
	    fprintf(stderr, "OutOfMemoryException.\n");
	    return false;
    }
    catch (...) {
        fprintf(stderr, "parsing personal-schema.xml failed at line %i\n", __LINE__);
        return false;
    }

    // test only if there is no error
    if (!parser->getErrorCount()) {

        //Setup testing strings
        XMLCh *fileSchema = XMLString::transcode("file://");
        XMLCh *filePath = XMLString::transcode("samples/data/personal-schema.xml");

        //Test document baseURI
        DOMDocument *document = parser->getDocument();

        //The baseURI should contain `file://' and `samples/data/personal-schema.xml'
        const XMLCh *docBaseURI = document->getBaseURI();

        if(XMLString::patternMatch(docBaseURI, fileSchema) == -1) {
            OK = false;
            fprintf(stderr, "checking baseURI failed at line %i\n", __LINE__);
        }

        if(XMLString::patternMatch(docBaseURI, filePath) == -1) {
            OK = false;
            fprintf(stderr, "checking baseURI failed at line %i\n", __LINE__);
        }

        //Create relative paths from document baseURI

        XMLCh *docBaseURIRoot = new XMLCh [ XMLString::stringLen(docBaseURI) ];
        XMLString::copyNString(docBaseURIRoot, docBaseURI, XMLString::lastIndexOf(docBaseURI, chForwardSlash) + 1);

        XMLCh *base_foobar = new XMLCh [ XMLString::stringLen(docBaseURIRoot) + 8];
        XMLString::copyString(base_foobar, docBaseURIRoot);
        XMLCh *foobar = XMLString::transcode("foo/bar");
        XMLString::catString(base_foobar, foobar);

        XMLCh *base_foobarbar = new XMLCh [ XMLString::stringLen(docBaseURIRoot) + 12];
        XMLString::copyString(base_foobarbar, docBaseURIRoot);
        XMLCh *foobarbar = XMLString::transcode("foo/bar/bar");
        XMLString::catString(base_foobarbar, foobarbar);

        XMLCh *base_foocarbar = new XMLCh [ XMLString::stringLen(docBaseURIRoot) + 12];
        XMLString::copyString(base_foocarbar, docBaseURIRoot);
        XMLCh *foocarbar = XMLString::transcode("foo/car/bar");
        XMLString::catString(base_foocarbar, foocarbar);

        XMLCh *file_autobar = XMLString::transcode("file:///auto/bar");
        XMLCh *file_carfoo = XMLString::transcode("file:///car/foo/");
        XMLCh *file_carfoobarbar = XMLString::transcode("file:///car/foo/bar/bar");

        XMLCh *http_carcar = XMLString::transcode("http://www.example.com/car/car");
        XMLCh *http_barfoo = XMLString::transcode("http://www.example.com/bar/foo/");
        XMLCh *http_barfoofoobar = XMLString::transcode("http://www.example.com/bar/foo/foo/bar");

        //Processing instruction before Document Element (has document baseURI)

        DOMNode *node = document->getFirstChild();
        while(node->getNodeType() != DOMNode::PROCESSING_INSTRUCTION_NODE)
            node = node->getNextSibling();

        if(XMLString::compareString(node->getBaseURI(), docBaseURI) != 0) {
            OK = false;
            fprintf(stderr, "checking baseURI failed at line %i\n",  __LINE__);
        }

        //Document Element baseURI (same as document)

        node = document->getDocumentElement();

        if(XMLString::compareString(node->getBaseURI(), docBaseURI) != 0) {
            OK = false;
            fprintf(stderr, "checking baseURI, failed at line %i\n", __LINE__);
        }

        // <level 1>

        node = node->getFirstChild();
        while(node->getNodeType() != DOMNode::ELEMENT_NODE)
            node = node->getNextSibling();

        DOMNode *level1 = node;

        // <one>

        node = node->getFirstChild();
        while(node->getNodeType() != DOMNode::ELEMENT_NODE)
            node = node->getNextSibling();

        if(XMLString::compareString(node->getBaseURI(), base_foobar) != 0) {
            OK = false;
            fprintf(stderr, "checking baseURI failed at line %i\n",  __LINE__);
        }

        // <inner1>

        node = node->getFirstChild();
        while(node->getNodeType() != DOMNode::ELEMENT_NODE)
            node = node->getNextSibling();

        if(XMLString::compareString(node->getBaseURI(), base_foobarbar) != 0) {
            OK = false;
            fprintf(stderr, "checking baseURI failed at line %i\n",  __LINE__);
        }

        // <inner2>

        node = node->getNextSibling();
        while(node->getNodeType() != DOMNode::ELEMENT_NODE)
            node = node->getNextSibling();

        if(XMLString::compareString(node->getBaseURI(), base_foocarbar) != 0) {
            OK = false;
            fprintf(stderr, "checking baseURI failed at line %i\n",  __LINE__);
        }

        // <?proc-inst-2?>

        node = node->getNextSibling();
        while(node->getNodeType() != DOMNode::PROCESSING_INSTRUCTION_NODE)
            node = node->getNextSibling();

        if(XMLString::compareString(node->getBaseURI(), base_foobar) != 0) {
            OK = false;
            fprintf(stderr, "checking baseURI failed at line %i\n",  __LINE__);
        }

        // <level2>

        node = level1->getNextSibling();
        while(node->getNodeType() != DOMNode::ELEMENT_NODE)
            node = node->getNextSibling();

        DOMNode *level2 = node;

        if(XMLString::compareString(node->getBaseURI(), file_autobar) != 0) {
            OK = false;
            fprintf(stderr, "checking baseURI failed at line %i\n",  __LINE__);
        }

        // <two>

        node = node->getFirstChild();
        while(node->getNodeType() != DOMNode::ELEMENT_NODE)
            node = node->getNextSibling();

        if(XMLString::compareString(node->getBaseURI(), file_carfoo) != 0) {
            OK = false;
            fprintf(stderr, "checking baseURI failed at line %i\n",  __LINE__);
        }

        // <inner1>

        node = node->getFirstChild();
        while(node->getNodeType() != DOMNode::ELEMENT_NODE)
            node = node->getNextSibling();

        if(XMLString::compareString(node->getBaseURI(), file_carfoobarbar) != 0) {
            OK = false;
            fprintf(stderr, "checking baseURI failed at line %i\n",  __LINE__);
        }

        // <level3>

        node = level2->getNextSibling();
        while(node->getNodeType() != DOMNode::ELEMENT_NODE)
            node = node->getNextSibling();

        if(XMLString::compareString(node->getBaseURI(), http_carcar) != 0) {
            OK = false;
            fprintf(stderr, "checking baseURI failed at line %i\n",  __LINE__);
        }

        // <three>

        node = node->getFirstChild();
        while(node->getNodeType() != DOMNode::ELEMENT_NODE)
            node = node->getNextSibling();

        if(XMLString::compareString(node->getBaseURI(), http_barfoo) != 0) {
            OK = false;
            fprintf(stderr, "checking baseURI failed at line %i\n",  __LINE__);
        }

        // <inner1>

        node = node->getFirstChild();
        while(node->getNodeType() != DOMNode::ELEMENT_NODE)
            node = node->getNextSibling();

        if(XMLString::compareString(node->getBaseURI(), http_barfoofoobar) != 0) {
            OK = false;
            fprintf(stderr, "checking baseURI failed at line %i\n",  __LINE__);
        }
    }
    else {
        printf("baseURI test was not carried out\n");
    }

    return OK;
}